

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O3

dtree_t * read_final_tree(FILE *fp,pset_t *pset,uint32 n_pset)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  dtree_t *pdVar4;
  lineiter_t *plVar5;
  dtree_node_t *pdVar6;
  ulong uVar7;
  ulong uVar8;
  comp_quest_t *q;
  ulong uVar9;
  dtree_node_t *pdVar10;
  char *pcVar11;
  uint32 n_scan;
  float32 occ;
  uint32 node_id;
  uint32 n_node;
  float64 ent;
  char str [128];
  uint local_f0;
  int local_ec;
  float32 local_e8;
  uint local_e4;
  dtree_t *local_e0;
  uint32 local_d8;
  uint local_d4;
  float64 local_d0;
  pset_t *local_c8;
  lineiter_t *local_c0;
  short local_b8;
  undefined1 uStack_b6;
  int iStack_b5;
  
  local_d8 = n_pset;
  local_c8 = pset;
  pdVar4 = (dtree_t *)
           __ckd_calloc__(1,0x10,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                          ,0x111);
  plVar5 = lineiter_start_clean(fp);
  pcVar11 = plVar5->buf;
  __isoc99_sscanf(pcVar11,"%s%n",&local_b8,&local_f0);
  if (iStack_b5 == 0x65646f &&
      CONCAT13((undefined1)iStack_b5,CONCAT12(uStack_b6,local_b8)) == 0x6f6e5f6e) {
    __isoc99_sscanf(pcVar11 + local_f0,"%u",&local_d4);
    pdVar4->n_node = local_d4;
    pdVar6 = (dtree_node_t *)
             __ckd_calloc__((ulong)local_d4,0x68,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                            ,0x120);
    pdVar4->node = pdVar6;
    if (local_d4 != 0) {
      uVar7 = 0;
      pdVar10 = pdVar6;
      do {
        pdVar10->node_id = (uint32)uVar7;
        uVar7 = uVar7 + 1;
        pdVar10 = pdVar10 + 1;
      } while (uVar7 < local_d4);
    }
    local_e0 = pdVar4;
    plVar5 = lineiter_next(plVar5);
    pdVar4 = local_e0;
    if (plVar5 != (lineiter_t *)0x0) {
      local_ec = 0;
      do {
        pcVar11 = plVar5->buf;
        local_c0 = plVar5;
        __isoc99_sscanf(pcVar11,"%u%n",&local_e4,&local_f0);
        pcVar11 = pcVar11 + local_f0;
        __isoc99_sscanf(pcVar11,"%s%n",&local_b8,&local_f0);
        uVar7 = (ulong)local_f0;
        uVar1 = 0xffffffff;
        if (local_b8 != 0x2d) {
          uVar1 = atoi((char *)&local_b8);
        }
        pcVar11 = pcVar11 + uVar7;
        __isoc99_sscanf(pcVar11,"%s%n",&local_b8,&local_f0);
        uVar9 = (ulong)local_f0;
        uVar7 = 0xffffffff;
        if (local_b8 != 0x2d) {
          uVar2 = atoi((char *)&local_b8);
          uVar7 = (ulong)uVar2;
        }
        pcVar11 = pcVar11 + uVar9;
        __isoc99_sscanf(pcVar11,"%le%n",&local_d0,&local_f0);
        uVar9 = (ulong)local_f0;
        __isoc99_sscanf(pcVar11 + uVar9,"%e%n",&local_e8,&local_f0);
        if (uVar1 == 0xffffffff) {
          uVar7 = (ulong)local_e4;
          pdVar6[uVar7].q = (void *)0x0;
          pdVar6[uVar7].wt_ent = local_d0;
          pdVar6[uVar7].occ = local_e8;
          pdVar6[uVar7].y = (dtree_node_str *)0x0;
          (&pdVar6[uVar7].y)[1] = (dtree_node_str *)0x0;
        }
        else {
          uVar8 = (ulong)local_f0;
          q = (comp_quest_t *)
              __ckd_calloc__(1,0x18,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                             ,0x142);
          iVar3 = s3parse_comp_quest(local_c8,local_d8,q,pcVar11 + uVar9 + uVar8);
          if (iVar3 != 0) {
            local_ec = 1;
          }
          uVar9 = (ulong)local_e4;
          pdVar6[uVar9].q = q;
          pdVar6[uVar9].wt_ent_dec = local_d0;
          pdVar6[uVar9].occ = local_e8;
          pdVar6[uVar9].y = pdVar6 + uVar1;
          pdVar6[uVar9].n = pdVar6 + uVar7;
          pdVar6[uVar7].p = pdVar6 + uVar9;
          pdVar6[uVar1].p = pdVar6 + uVar9;
        }
        plVar5 = lineiter_next(local_c0);
      } while (plVar5 != (lineiter_t *)0x0);
      pdVar4 = local_e0;
      if (local_ec == 1) {
        free_tree(local_e0);
        pdVar4 = (dtree_t *)0x0;
      }
    }
    lineiter_free((lineiter_t *)0x0);
    return pdVar4;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
          ,0x11c,"Format error; expecting n_node\n");
  exit(1);
}

Assistant:

dtree_t *
read_final_tree(FILE *fp,
		pset_t *pset,
		uint32 n_pset)
{
    dtree_t *out;
    dtree_node_t *node;
    uint32  n_node;
    char *s, str[128];
    lineiter_t *ln = NULL;
    uint32 n_scan;
    uint32 i, node_id, node_id_y, node_id_n;
    comp_quest_t *q;
    float64 ent;
    float32 occ;
    int err;

    out = ckd_calloc(1, sizeof(dtree_t));

    ln = lineiter_start_clean(fp);
    
    s = ln->buf;
    sscanf(s, "%s%n", str, &n_scan);
    if (strcmp(str, "n_node") == 0) {
	s += n_scan;
	sscanf(s, "%u", &n_node);
    }
    else {
	E_FATAL("Format error; expecting n_node\n");
    }

    out->n_node = n_node;
    out->node = node = ckd_calloc(n_node, sizeof(dtree_node_t));

    for (i = 0; i < n_node; i++)
	node[i].node_id = i;
    
    err = FALSE;
    
    while ((ln = lineiter_next(ln))) {
	s = ln->buf;

	sscanf(s, "%u%n", &node_id, &n_scan);
	s += n_scan;
	sscanf(s, "%s%n", str, &n_scan);
	s += n_scan;
	if (strcmp(str, "-") == 0) {
	    node_id_y = NO_ID;
	}
	else {
	    node_id_y = atoi(str);
	}
	sscanf(s, "%s%n", str, &n_scan);
	s += n_scan;
	if (strcmp(str, "-") == 0) {
	    node_id_n = NO_ID;
	}
	else {
	    node_id_n = atoi(str);
	}
	sscanf(s, "%le%n", &ent, &n_scan);
	s += n_scan;
	sscanf(s, "%e%n", &occ, &n_scan);
	s += n_scan;

	if ((node_id_y != NO_ID) && (node_id_y != NO_ID)) {
	    q = (comp_quest_t *)ckd_calloc(1, sizeof(comp_quest_t));
	    if (s3parse_comp_quest(pset, n_pset, q, s) != S3_SUCCESS) {
		err = TRUE;
	    }

	    node[node_id].q = q;
	}
	else
	    node[node_id].q = NULL;

	/* ck if internal node */
	if ((node_id_y != NO_ID) && (node_id_y != NO_ID))
	    node[node_id].wt_ent_dec = ent;
	else
	    node[node_id].wt_ent = ent;

	node[node_id].occ = occ;

	if ((node_id_y != NO_ID) && (node_id_y != NO_ID)) {
	    node[node_id].y = &node[node_id_y];
	    node[node_id].n = &node[node_id_n];
	    node[node_id_y].p = node[node_id_n].p = &node[node_id];
	}
	else {
	    node[node_id].y = NULL;
	    node[node_id].n = NULL;
	}
    }

    if (err == TRUE) {
	free_tree(out);
	out = NULL;
    }

    lineiter_free(ln);
    return out;
}